

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv2022.cpp
# Opt level: O3

void UConverter_fromUnicode_ISO_2022_KR_OFFSETS_LOGIC
               (UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  UChar UVar1;
  ushort uVar2;
  uint uVar3;
  UChar *pUVar4;
  UConverter *pUVar5;
  void *pvVar6;
  UConverter *pUVar7;
  uint16_t *puVar8;
  int32_t *cx;
  UErrorCode UVar9;
  uint32_t uVar10;
  int32_t iVar11;
  uint uVar12;
  byte bVar13;
  byte bVar14;
  UChar *pUVar15;
  char cVar16;
  int iVar17;
  byte *pbVar18;
  byte *pbVar19;
  long lVar20;
  byte *targetLimit;
  UConverterSharedData *pUVar21;
  UChar *pUVar22;
  UConverter *saveConv;
  UConverterDataISO2022 *myConverterData;
  UChar *pUVar23;
  bool bVar24;
  uint32_t targetByteUnit;
  char local_69;
  int32_t *offsets;
  int local_5c;
  UConverterSharedData *local_58;
  UChar *local_50;
  byte *local_48;
  UErrorCode *local_40;
  byte *local_38;
  
  pUVar15 = args->source;
  pUVar4 = args->sourceLimit;
  pbVar19 = (byte *)args->target;
  targetLimit = (byte *)args->targetLimit;
  offsets = args->offsets;
  targetByteUnit = 0;
  pUVar5 = args->converter;
  pvVar6 = pUVar5->extraInfo;
  pUVar7 = *(UConverter **)((long)pvVar6 + 0x50);
  if (*(int *)((long)pvVar6 + 0x6c) == 1) {
    args->converter = pUVar7;
    pUVar7->fromUChar32 = pUVar5->fromUChar32;
    ucnv_MBCSFromUnicodeWithOffsets_63(args,err);
    lVar20 = *(long *)((long)pvVar6 + 0x50);
    pUVar5->fromUChar32 = *(UChar32 *)(lVar20 + 0x54);
    if (*err == U_BUFFER_OVERFLOW_ERROR) {
      cVar16 = *(char *)(lVar20 + 0x5b);
      if (0 < (long)cVar16) {
        memcpy(pUVar5->charErrorBuffer,(void *)(lVar20 + 0x68),(long)cVar16);
        lVar20 = *(long *)((long)pvVar6 + 0x50);
        cVar16 = *(char *)(lVar20 + 0x5b);
      }
      pUVar5->charErrorBufferLength = cVar16;
      *(undefined1 *)(lVar20 + 0x5b) = 0;
    }
    args->converter = pUVar5;
  }
  else {
    cVar16 = (char)pUVar5->fromUnicodeStatus;
    uVar12 = pUVar5->fromUChar32;
    if (uVar12 == 0 || targetLimit <= pbVar19) {
      if (pUVar15 < pUVar4) {
        pUVar21 = pUVar7->sharedData;
        local_69 = pUVar5->useFallback;
        local_5c = (int)local_69;
        pUVar23 = pUVar15;
        do {
          pUVar23 = pUVar23 + 1;
          targetByteUnit = 0xffff;
          if (args->targetLimit <= pbVar19) {
            *err = U_BUFFER_OVERFLOW_ERROR;
            goto LAB_001b563a;
          }
          UVar1 = *pUVar15;
          uVar12 = (uint)(ushort)UVar1;
          if ((uVar12 < 0x20) && ((0x800c000U >> (uVar12 & 0x1f) & 1) != 0)) {
            *err = U_ILLEGAL_CHAR_FOUND;
            args->converter->fromUChar32 = uVar12;
            pUVar15 = pUVar15 + 1;
            goto LAB_001b563a;
          }
          puVar8 = (pUVar21->mbcs).fromUnicodeTable;
          uVar3 = *(uint *)(puVar8 + (ulong)(((ushort)UVar1 >> 4 & 0x3f) +
                                            (uint)puVar8[(ushort)UVar1 >> 10]) * 2);
          uVar2 = *(ushort *)
                   ((pUVar21->mbcs).fromUnicodeBytes +
                   (ulong)((uVar3 & 0xffff) << 4 | uVar12 & 0xf) * 2);
          uVar10 = (uint32_t)uVar2;
          iVar17 = 2 - (uint)(uVar10 < 0x100);
          pUVar22 = pUVar15;
          if ((((uVar3 >> (sbyte)(uVar12 & 0xf)) >> 0x10 & 1) == 0) &&
             ((local_69 == '\0' && uVar12 - 0xf900 < 0xffffe700 || (uVar2 == 0)))) {
            cx = (pUVar21->mbcs).extIndexes;
            if (cx != (int32_t *)0x0) {
              local_58 = pUVar21;
              local_50 = pUVar15;
              local_48 = targetLimit;
              local_40 = err;
              iVar11 = ucnv_extSimpleMatchFromU_63(cx,uVar12,&targetByteUnit,(UBool)local_5c);
              targetLimit = local_48;
              pUVar21 = local_58;
              err = local_40;
              pUVar22 = local_50;
              iVar17 = -iVar11;
              uVar10 = targetByteUnit;
              if (0 < iVar11) {
                iVar17 = iVar11;
              }
              goto LAB_001b53e7;
            }
LAB_001b55fd:
            targetByteUnit = 0xffff;
LAB_001b5605:
            pUVar15 = pUVar15 + 1;
            UVar9 = U_INVALID_CHAR_FOUND;
            if (((uVar12 & 0xf800) != 0xd800) ||
               (UVar9 = U_ILLEGAL_CHAR_FOUND, ((ushort)UVar1 >> 10 & 1) != 0)) goto LAB_001b562f;
            goto LAB_001b52d5;
          }
LAB_001b53e7:
          targetByteUnit = uVar10;
          pUVar15 = pUVar22;
          if (((iVar17 - 3U < 0xfffffffe) || (iVar17 == 1 && 0x7f < targetByteUnit)) ||
             ((iVar17 == 2 &&
              ((0x5d5d < (targetByteUnit + 0x5e5f & 0xfffe) ||
               (0x5d < (targetByteUnit + 0x5f & 0xfe))))))) goto LAB_001b55fd;
          if (targetByteUnit == 0xffff) goto LAB_001b5605;
          bVar24 = 0xff < targetByteUnit;
          pbVar18 = pbVar19;
          if ((int)cVar16 != (uint)bVar24) {
            *pbVar19 = 0xff < targetByteUnit ^ 0xf;
            pbVar18 = pbVar19 + 1;
            if (offsets != (int32_t *)0x0) {
              *offsets = (int)((ulong)((long)pUVar23 - (long)args->source) >> 1) + -1;
              offsets = offsets + 1;
            }
          }
          bVar13 = (byte)targetByteUnit;
          if (targetByteUnit < 0x100) {
            if (pbVar18 < targetLimit) {
              *pbVar18 = bVar13;
              pbVar19 = pbVar18 + 1;
LAB_001b54ee:
              if (offsets != (int32_t *)0x0) {
                *offsets = (int)((ulong)((long)pUVar23 - (long)args->source) >> 1) + -1;
                offsets = offsets + 1;
              }
            }
            else {
              pUVar5 = args->converter;
              cVar16 = pUVar5->charErrorBufferLength;
              pUVar5->charErrorBufferLength = cVar16 + '\x01';
              pUVar5->charErrorBuffer[cVar16] = bVar13;
LAB_001b5556:
              *err = U_BUFFER_OVERFLOW_ERROR;
              pbVar19 = pbVar18;
            }
          }
          else {
            bVar14 = (char)(targetByteUnit >> 8) + 0x80;
            if (targetLimit <= pbVar18) {
              pUVar5 = args->converter;
              cVar16 = pUVar5->charErrorBufferLength;
              pUVar5->charErrorBufferLength = cVar16 + '\x01';
              pUVar5->charErrorBuffer[cVar16] = bVar14;
              pUVar5 = args->converter;
              cVar16 = pUVar5->charErrorBufferLength;
              pUVar5->charErrorBufferLength = cVar16 + '\x01';
              pUVar5->charErrorBuffer[cVar16] = bVar13 + 0x80;
              goto LAB_001b5556;
            }
            *pbVar18 = bVar14;
            if (offsets != (int32_t *)0x0) {
              *offsets = (int)((ulong)((long)pUVar23 - (long)args->source) >> 1) + -1;
              offsets = offsets + 1;
            }
            pbVar19 = pbVar18 + 1;
            if (pbVar19 < targetLimit) {
              pbVar18[1] = bVar13 + 0x80;
              pbVar19 = pbVar18 + 2;
              goto LAB_001b54ee;
            }
            pUVar5 = args->converter;
            cVar16 = pUVar5->charErrorBufferLength;
            pUVar5->charErrorBufferLength = cVar16 + '\x01';
            pUVar5->charErrorBuffer[cVar16] = bVar13 + 0x80;
            *err = U_BUFFER_OVERFLOW_ERROR;
          }
          pUVar15 = pUVar22 + 1;
          cVar16 = bVar24;
        } while (pUVar15 < pUVar4);
        pUVar15 = pUVar22 + 1;
      }
    }
    else {
LAB_001b52d5:
      UVar9 = U_ZERO_ERROR;
      if (pUVar15 < pUVar4) {
        bVar24 = ((ushort)*pUVar15 & 0xfc00) == 0xdc00;
        UVar9 = !bVar24 + 10 + (uint)!bVar24;
        uVar3 = uVar12 * 0x400 + (uint)(ushort)*pUVar15 + 0xfca02400;
        if (!bVar24) {
          uVar3 = uVar12;
        }
        uVar12 = uVar3;
        pUVar15 = pUVar15 + bVar24;
      }
LAB_001b562f:
      *err = UVar9;
      args->converter->fromUChar32 = uVar12;
    }
LAB_001b563a:
    local_38 = pbVar19;
    if ((((*err < U_ILLEGAL_ARGUMENT_ERROR) && (cVar16 != '\0')) && (args->flush != '\0')) &&
       ((pUVar4 <= pUVar15 && (args->converter->fromUChar32 == 0)))) {
      pUVar4 = args->source;
      iVar17 = (int)((ulong)((long)pUVar15 - (long)pUVar4) >> 1);
      if (iVar17 < 1) {
        uVar12 = 0xffffffff;
      }
      else {
        uVar12 = iVar17 - 1;
        if (((pUVar4[uVar12] & 0xfc00U) == 0xdc00) &&
           ((uVar12 == 0 || ((pUVar4[iVar17 - 2] & 0xfc00U) == 0xd800)))) {
          uVar12 = iVar17 - 2;
        }
      }
      ucnv_fromUWriteBytes_63
                (args->converter,"\x0f",1,(char **)&local_38,(char *)targetLimit,&offsets,uVar12,err
                );
      cVar16 = '\0';
    }
    args->source = pUVar15;
    args->target = (char *)local_38;
    args->converter->fromUnicodeStatus = (int)cVar16;
  }
  return;
}

Assistant:

static void U_CALLCONV
UConverter_fromUnicode_ISO_2022_KR_OFFSETS_LOGIC(UConverterFromUnicodeArgs* args, UErrorCode* err){

    const UChar *source = args->source;
    const UChar *sourceLimit = args->sourceLimit;
    unsigned char *target = (unsigned char *) args->target;
    unsigned char *targetLimit = (unsigned char *) args->targetLimit;
    int32_t* offsets = args->offsets;
    uint32_t targetByteUnit = 0x0000;
    UChar32 sourceChar = 0x0000;
    UBool isTargetByteDBCS;
    UBool oldIsTargetByteDBCS;
    UConverterDataISO2022 *converterData;
    UConverterSharedData* sharedData;
    UBool useFallback;
    int32_t length =0;

    converterData=(UConverterDataISO2022*)args->converter->extraInfo;
    /* if the version is 1 then the user is requesting
     * conversion with ibm-25546 pass the arguments to
     * MBCS converter and return
     */
    if(converterData->version==1){
        UConverter_fromUnicode_ISO_2022_KR_OFFSETS_LOGIC_IBM(args,err);
        return;
    }

    /* initialize data */
    sharedData = converterData->currentConverter->sharedData;
    useFallback = args->converter->useFallback;
    isTargetByteDBCS=(UBool)args->converter->fromUnicodeStatus;
    oldIsTargetByteDBCS = isTargetByteDBCS;

    isTargetByteDBCS   = (UBool) args->converter->fromUnicodeStatus;
    if((sourceChar = args->converter->fromUChar32)!=0 && target <targetLimit) {
        goto getTrail;
    }
    while(source < sourceLimit){

        targetByteUnit = missingCharMarker;

        if(target < (unsigned char*) args->targetLimit){
            sourceChar = *source++;

            /* do not convert SO/SI/ESC */
            if(IS_2022_CONTROL(sourceChar)) {
                /* callback(illegal) */
                *err=U_ILLEGAL_CHAR_FOUND;
                args->converter->fromUChar32=sourceChar;
                break;
            }

            length = MBCS_FROM_UCHAR32_ISO2022(sharedData,sourceChar,&targetByteUnit,useFallback,MBCS_OUTPUT_2);
            if(length < 0) {
                length = -length;  /* fallback */
            }
            /* only DBCS or SBCS characters are expected*/
            /* DB characters with high bit set to 1 are expected */
            if( length > 2 || length==0 ||
                (length == 1 && targetByteUnit > 0x7f) ||
                (length == 2 &&
                    ((uint16_t)(targetByteUnit - 0xa1a1) > (0xfefe - 0xa1a1) ||
                    (uint8_t)(targetByteUnit - 0xa1) > (0xfe - 0xa1)))
            ) {
                targetByteUnit=missingCharMarker;
            }
            if (targetByteUnit != missingCharMarker){

                oldIsTargetByteDBCS = isTargetByteDBCS;
                isTargetByteDBCS = (UBool)(targetByteUnit>0x00FF);
                  /* append the shift sequence */
                if (oldIsTargetByteDBCS != isTargetByteDBCS ){

                    if (isTargetByteDBCS)
                        *target++ = UCNV_SO;
                    else
                        *target++ = UCNV_SI;
                    if(offsets)
                        *(offsets++) = (int32_t)(source - args->source-1);
                }
                /* write the targetUniChar  to target */
                if(targetByteUnit <= 0x00FF){
                    if( target < targetLimit){
                        *(target++) = (unsigned char) targetByteUnit;
                        if(offsets){
                            *(offsets++) = (int32_t)(source - args->source-1);
                        }

                    }else{
                        args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (unsigned char) (targetByteUnit);
                        *err = U_BUFFER_OVERFLOW_ERROR;
                    }
                }else{
                    if(target < targetLimit){
                        *(target++) =(unsigned char) ((targetByteUnit>>8) -0x80);
                        if(offsets){
                            *(offsets++) = (int32_t)(source - args->source-1);
                        }
                        if(target < targetLimit){
                            *(target++) =(unsigned char) (targetByteUnit -0x80);
                            if(offsets){
                                *(offsets++) = (int32_t)(source - args->source-1);
                            }
                        }else{
                            args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (unsigned char) (targetByteUnit -0x80);
                            *err = U_BUFFER_OVERFLOW_ERROR;
                        }
                    }else{
                        args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (unsigned char) ((targetByteUnit>>8) -0x80);
                        args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (unsigned char) (targetByteUnit-0x80);
                        *err = U_BUFFER_OVERFLOW_ERROR;
                    }
                }

            }
            else{
                /* oops.. the code point is unassingned
                 * set the error and reason
                 */

                /*check if the char is a First surrogate*/
                if(U16_IS_SURROGATE(sourceChar)) {
                    if(U16_IS_SURROGATE_LEAD(sourceChar)) {
getTrail:
                        /*look ahead to find the trail surrogate*/
                        if(source <  sourceLimit) {
                            /* test the following code unit */
                            UChar trail=(UChar) *source;
                            if(U16_IS_TRAIL(trail)) {
                                source++;
                                sourceChar=U16_GET_SUPPLEMENTARY(sourceChar, trail);
                                *err = U_INVALID_CHAR_FOUND;
                                /* convert this surrogate code point */
                                /* exit this condition tree */
                            } else {
                                /* this is an unmatched lead code unit (1st surrogate) */
                                /* callback(illegal) */
                                *err=U_ILLEGAL_CHAR_FOUND;
                            }
                        } else {
                            /* no more input */
                            *err = U_ZERO_ERROR;
                        }
                    } else {
                        /* this is an unmatched trail code unit (2nd surrogate) */
                        /* callback(illegal) */
                        *err=U_ILLEGAL_CHAR_FOUND;
                    }
                } else {
                    /* callback(unassigned) for a BMP code point */
                    *err = U_INVALID_CHAR_FOUND;
                }

                args->converter->fromUChar32=sourceChar;
                break;
            }
        } /* end if(myTargetIndex<myTargetLength) */
        else{
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }

    }/* end while(mySourceIndex<mySourceLength) */

    /*
     * the end of the input stream and detection of truncated input
     * are handled by the framework, but for ISO-2022-KR conversion
     * we need to be in ASCII mode at the very end
     *
     * conditions:
     *   successful
     *   not in ASCII mode
     *   end of input and no truncated input
     */
    if( U_SUCCESS(*err) &&
        isTargetByteDBCS &&
        args->flush && source>=sourceLimit && args->converter->fromUChar32==0
    ) {
        int32_t sourceIndex;

        /* we are switching to ASCII */
        isTargetByteDBCS=FALSE;

        /* get the source index of the last input character */
        /*
         * TODO this would be simpler and more reliable if we used a pair
         * of sourceIndex/prevSourceIndex like in ucnvmbcs.c
         * so that we could simply use the prevSourceIndex here;
         * this code gives an incorrect result for the rare case of an unmatched
         * trail surrogate that is alone in the last buffer of the text stream
         */
        sourceIndex=(int32_t)(source-args->source);
        if(sourceIndex>0) {
            --sourceIndex;
            if( U16_IS_TRAIL(args->source[sourceIndex]) &&
                (sourceIndex==0 || U16_IS_LEAD(args->source[sourceIndex-1]))
            ) {
                --sourceIndex;
            }
        } else {
            sourceIndex=-1;
        }

        fromUWriteUInt8(
            args->converter,
            SHIFT_IN_STR, 1,
            &target, (const char *)targetLimit,
            &offsets, sourceIndex,
            err);
    }

    /*save the state and return */
    args->source = source;
    args->target = (char*)target;
    args->converter->fromUnicodeStatus = (uint32_t)isTargetByteDBCS;
}